

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateExtensionRegistrationCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  undefined1 local_58 [40];
  
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x68)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)local_58,
                 (FieldDescriptor *)(*(long *)(pDVar1 + 0x70) + lVar2));
      ExtensionGenerator::GenerateRegistrationCode((ExtensionGenerator *)local_58,printer);
      ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)local_58);
      lVar3 = lVar3 + 1;
      pDVar1 = this->descriptor_;
      lVar2 = lVar2 + 0x78;
    } while (lVar3 < *(int *)(pDVar1 + 0x68));
  }
  if (0 < *(int *)(pDVar1 + 0x38)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      local_58._0_8_ = *(long *)(pDVar1 + 0x40) + lVar3;
      FieldGeneratorMap::FieldGeneratorMap
                ((FieldGeneratorMap *)(local_58 + 8),(Descriptor *)local_58._0_8_);
      GenerateExtensionRegistrationCode((MessageGenerator *)local_58,printer);
      FieldGeneratorMap::~FieldGeneratorMap((FieldGeneratorMap *)(local_58 + 8));
      lVar2 = lVar2 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0x78;
    } while (lVar2 < *(int *)(pDVar1 + 0x38));
  }
  return;
}

Assistant:

void MessageGenerator::GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i))
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator(descriptor_->nested_type(i))
      .GenerateExtensionRegistrationCode(printer);
  }
}